

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx512.cpp
# Opt level: O1

int __thiscall ncnn::Gemm_x86_avx512::create_pipeline_int8(Gemm_x86_avx512 *this,Option *opt)

{
  Mat *A;
  undefined1 auVar1 [16];
  void *pvVar2;
  Allocator *pAVar3;
  size_t sVar4;
  Mat *pMVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  undefined1 (*pauVar11) [32];
  int *piVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  undefined1 *puVar23;
  long lVar24;
  undefined1 *puVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  undefined1 (*pauVar29) [16];
  undefined1 (*pauVar30) [16];
  long lVar31;
  uint uVar32;
  uint uVar33;
  long lVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  undefined8 *puVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_ZMM1 [64];
  undefined1 in_ZMM2 [64];
  int TILE_K;
  Mat *local_e0;
  undefined8 local_d8;
  ulong local_d0;
  ulong local_c8;
  uint local_bc;
  int TILE_N;
  int TILE_M;
  undefined8 local_b0;
  undefined1 local_a8 [44];
  int iStack_7c;
  undefined8 uStack_78;
  int local_70;
  size_t local_68;
  Gemm_x86_avx512 *local_58;
  long local_50;
  Option *local_48;
  ulong local_40;
  long local_38;
  
  local_58 = this;
  if ((this->super_Gemm).constantA == 0) {
LAB_004c98d7:
    if ((this->super_Gemm).constantB != 0) {
      uVar8 = (this->super_Gemm).constantN;
      iVar35 = (this->super_Gemm).constantK;
      get_optimal_tile_mnk_int8
                (0,uVar8,iVar35,(this->super_Gemm).constant_TILE_M,
                 (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M,
                 &TILE_N,&TILE_K,opt->num_threads);
      uVar6 = (int)(uVar8 + TILE_N + -1) / TILE_N;
      local_40 = (ulong)uVar8;
      Mat::create(&this->BT_data,TILE_N * TILE_K,(TILE_K + iVar35 + -1) / TILE_K,uVar6,1,
                  (Allocator *)0x0);
      if ((this->BT_data).data == (void *)0x0) {
        bVar39 = true;
      }
      else {
        bVar39 = (long)(this->BT_data).c * (this->BT_data).cstep == 0;
      }
      if (bVar39) goto LAB_004c99a5;
      local_48 = opt;
      if (0 < (int)uVar6) {
        local_e0 = &(this->super_Gemm).B_data;
        local_d0 = 0;
        do {
          if (0 < iVar35) {
            iVar36 = TILE_N * (int)local_d0;
            uVar8 = (int)local_40 - iVar36;
            lVar16 = (long)iVar36;
            iVar18 = 0;
            do {
              iVar7 = TILE_K;
              uVar9 = uVar8;
              if (TILE_N < (int)uVar8) {
                uVar9 = TILE_N;
              }
              uVar33 = iVar35 - iVar18;
              uVar32 = uVar33;
              if (TILE_K < (int)uVar33) {
                uVar32 = TILE_K;
              }
              local_a8._16_8_ = (this->BT_data).elemsize;
              iStack_7c = (this->BT_data).w;
              local_68 = (size_t)iStack_7c;
              local_a8._24_4_ = (this->BT_data).elempack;
              local_a8._32_8_ = (this->BT_data).allocator;
              local_a8._0_8_ =
                   (long)(this->BT_data).data +
                   local_a8._16_8_ * local_68 * (long)(iVar18 / TILE_K) +
                   (long)(iVar36 / TILE_N) * (this->BT_data).cstep * local_a8._16_8_;
              local_a8._8_4_ = 0;
              local_a8._12_4_ = 0;
              local_a8._40_4_ = 2;
              uStack_78 = 0x100000001;
              local_70 = 1;
              if ((this->super_Gemm).transB == 0) {
                in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
                in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
                iVar7 = cpu_support_x86_avx512_vnni();
                if (iVar7 == 0) {
                  iVar7 = cpu_support_x86_avx_vnni_int8();
                  if (iVar7 == 0) {
                    iVar7 = cpu_support_x86_avx_vnni();
                    if (iVar7 == 0) {
                      iVar7 = (this->super_Gemm).B_data.w;
                      lVar13 = (long)iVar7;
                      uVar15 = 0;
                      pauVar11 = (undefined1 (*) [32])local_a8._0_8_;
                      if (0xf < (int)uVar9) {
                        uVar14 = 0;
                        do {
                          pvVar2 = (this->super_Gemm).B_data.data;
                          lVar22 = (long)(this->super_Gemm).B_data.w * (long)iVar18 *
                                   (this->super_Gemm).B_data.elemsize;
                          if ((int)uVar32 < 2) {
                            pauVar30 = (undefined1 (*) [16])
                                       ((long)pvVar2 + lVar22 + lVar16 + uVar14);
                            uVar33 = 0;
                          }
                          else {
                            lVar22 = (long)pvVar2 + lVar22 + uVar14;
                            iVar10 = 1;
                            do {
                              auVar40 = *(undefined1 (*) [16])(lVar22 + lVar16 + lVar13);
                              in_ZMM1 = ZEXT1664(auVar40);
                              auVar44 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar22 + lVar16),
                                                       auVar40);
                              in_ZMM2 = ZEXT1664(auVar44);
                              auVar40 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar22 + lVar16),
                                                       auVar40);
                              *(undefined1 (*) [16])*pauVar11 = auVar44;
                              *(undefined1 (*) [16])(*pauVar11 + 0x10) = auVar40;
                              pauVar11 = pauVar11 + 1;
                              lVar22 = lVar22 + iVar7 * 2;
                              iVar10 = iVar10 + 2;
                            } while (iVar10 < (int)uVar32);
                            pauVar30 = (undefined1 (*) [16])(lVar22 + lVar16);
                            uVar33 = uVar32 & 0xfffffffe;
                          }
                          iVar10 = uVar32 - uVar33;
                          if (iVar10 != 0 && (int)uVar33 <= (int)uVar32) {
                            do {
                              *(undefined1 (*) [16])*pauVar11 = *pauVar30;
                              pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
                              pauVar30 = (undefined1 (*) [16])(*pauVar30 + lVar13);
                              iVar10 = iVar10 + -1;
                            } while (iVar10 != 0);
                          }
                          uVar15 = uVar14 + 0x10;
                          uVar20 = uVar14 + 0x1f;
                          uVar14 = uVar15;
                        } while (uVar20 < uVar9);
                      }
                      if ((int)((uint)uVar15 | 7) < (int)uVar9) {
                        lVar22 = (uVar15 & 0xffffffff) + lVar16;
                        lVar21 = lVar22 + lVar13;
                        uVar14 = uVar15 & 0xffffffff;
                        do {
                          pvVar2 = (this->super_Gemm).B_data.data;
                          lVar24 = (long)(this->super_Gemm).B_data.w * (long)iVar18 *
                                   (this->super_Gemm).B_data.elemsize;
                          if ((int)uVar32 < 2) {
                            lVar27 = (long)pvVar2 + lVar16 + uVar14;
                            uVar33 = 0;
                          }
                          else {
                            lVar27 = (long)pvVar2 + lVar22;
                            lVar37 = (long)pvVar2 + lVar21;
                            iVar10 = 1;
                            do {
                              in_ZMM1 = ZEXT864(*(ulong *)(lVar37 + lVar24));
                              auVar43._8_8_ = 0;
                              auVar43._0_8_ = *(ulong *)(lVar27 + lVar24);
                              auVar45._8_8_ = 0;
                              auVar45._0_8_ = *(ulong *)(lVar37 + lVar24);
                              auVar40 = vpunpcklbw_avx(auVar43,auVar45);
                              *(undefined1 (*) [16])*pauVar11 = auVar40;
                              pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
                              iVar10 = iVar10 + 2;
                              lVar27 = lVar27 + iVar7 * 2;
                              lVar37 = lVar37 + iVar7 * 2;
                              uVar33 = uVar32 & 0xfffffffe;
                            } while (iVar10 < (int)uVar32);
                          }
                          puVar38 = (undefined8 *)(lVar27 + lVar24);
                          iVar10 = uVar32 - uVar33;
                          if (iVar10 != 0 && (int)uVar33 <= (int)uVar32) {
                            do {
                              *(undefined8 *)*pauVar11 = *puVar38;
                              pauVar11 = (undefined1 (*) [32])(*pauVar11 + 8);
                              puVar38 = (undefined8 *)((long)puVar38 + lVar13);
                              iVar10 = iVar10 + -1;
                            } while (iVar10 != 0);
                          }
                          uVar15 = uVar14 + 8;
                          lVar24 = uVar14 + 0xf;
                          lVar22 = lVar22 + 8;
                          lVar21 = lVar21 + 8;
                          uVar14 = uVar15;
                          this = local_58;
                        } while (lVar24 < (int)uVar9);
                      }
                      if ((int)((uint)uVar15 | 3) < (int)uVar9) {
                        local_38 = (long)iVar18;
                        lVar21 = (long)(iVar7 * 2);
                        local_bc = uVar32 & 0xfffffffe;
                        local_c8 = (ulong)(int)uVar9;
                        lVar22 = lVar16 + (uVar15 & 0xffffffff);
                        local_50 = (iVar7 + 3) + lVar22;
                        lVar24 = lVar22 + lVar13;
                        uVar14 = uVar15 & 0xffffffff;
                        uVar20 = (iVar7 + 2) + lVar22;
                        uVar26 = (iVar7 + 1) + lVar22;
                        do {
                          local_d8 = uVar26;
                          local_b0 = uVar20;
                          pvVar2 = (this->super_Gemm).B_data.data;
                          lVar27 = (this->super_Gemm).B_data.w * local_38 *
                                   (this->super_Gemm).B_data.elemsize;
                          if ((int)uVar32 < 2) {
                            lVar37 = (long)pvVar2 + lVar16 + uVar14;
                            uVar33 = 0;
                          }
                          else {
                            lVar37 = lVar22 + (long)pvVar2;
                            lVar31 = local_50 + (long)pvVar2;
                            lVar17 = local_b0 + (long)pvVar2;
                            lVar19 = local_d8 + (long)pvVar2;
                            lVar34 = (long)pvVar2 + lVar24;
                            iVar10 = 1;
                            do {
                              (*pauVar11)[0] = *(undefined1 *)(lVar37 + lVar27);
                              (*pauVar11)[1] = *(undefined1 *)(lVar34 + lVar27);
                              (*pauVar11)[2] = *(undefined1 *)(lVar37 + 1 + lVar27);
                              (*pauVar11)[3] = *(undefined1 *)(lVar19 + lVar27);
                              (*pauVar11)[4] = *(undefined1 *)(lVar37 + 2 + lVar27);
                              (*pauVar11)[5] = *(undefined1 *)(lVar17 + lVar27);
                              (*pauVar11)[6] = *(undefined1 *)(lVar37 + 3 + lVar27);
                              (*pauVar11)[7] = *(undefined1 *)(lVar31 + lVar27);
                              pauVar11 = (undefined1 (*) [32])(*pauVar11 + 8);
                              iVar10 = iVar10 + 2;
                              lVar37 = lVar37 + lVar21;
                              lVar31 = lVar31 + lVar21;
                              lVar17 = lVar17 + lVar21;
                              lVar19 = lVar19 + lVar21;
                              lVar34 = lVar34 + lVar21;
                              this = local_58;
                              uVar33 = local_bc;
                            } while (iVar10 < (int)uVar32);
                          }
                          iVar10 = uVar32 - uVar33;
                          if (iVar10 != 0 && (int)uVar33 <= (int)uVar32) {
                            puVar23 = (undefined1 *)(lVar37 + lVar27 + 3);
                            do {
                              (*pauVar11)[0] = puVar23[-3];
                              (*pauVar11)[1] = puVar23[-2];
                              (*pauVar11)[2] = puVar23[-1];
                              (*pauVar11)[3] = *puVar23;
                              pauVar11 = (undefined1 (*) [32])(*pauVar11 + 4);
                              puVar23 = puVar23 + lVar13;
                              iVar10 = iVar10 + -1;
                            } while (iVar10 != 0);
                          }
                          uVar15 = uVar14 + 4;
                          lVar27 = uVar14 + 7;
                          lVar22 = lVar22 + 4;
                          local_50 = local_50 + 4;
                          lVar24 = lVar24 + 4;
                          uVar14 = uVar15;
                          uVar20 = local_b0 + 4;
                          uVar26 = local_d8 + 4;
                        } while (lVar27 < (long)local_c8);
                      }
                      uVar33 = (uint)uVar15;
                      if ((int)(uVar33 | 1) < (int)uVar9) {
                        local_d8 = (ulong)iVar18;
                        lVar27 = (long)(iVar7 * 2);
                        local_b0 = CONCAT44(local_b0._4_4_,uVar32) & 0xfffffffffffffffe;
                        lVar22 = lVar16 + (int)uVar33;
                        lVar24 = (iVar7 + 1) + lVar22;
                        lVar21 = lVar22 + lVar13;
                        uVar14 = (long)(int)uVar33;
                        do {
                          pvVar2 = (this->super_Gemm).B_data.data;
                          lVar37 = (long)(this->super_Gemm).B_data.w * local_d8 *
                                   (this->super_Gemm).B_data.elemsize;
                          if ((int)uVar32 < 2) {
                            lVar31 = (long)pvVar2 + lVar16 + uVar14;
                            iVar7 = 0;
                          }
                          else {
                            lVar31 = lVar22 + (long)pvVar2;
                            lVar17 = lVar24 + (long)pvVar2;
                            lVar19 = (long)pvVar2 + lVar21;
                            iVar7 = 1;
                            do {
                              (*pauVar11)[0] = *(undefined1 *)(lVar31 + lVar37);
                              (*pauVar11)[1] = *(undefined1 *)(lVar19 + lVar37);
                              (*pauVar11)[2] = *(undefined1 *)(lVar31 + 1 + lVar37);
                              (*pauVar11)[3] = *(undefined1 *)(lVar17 + lVar37);
                              pauVar11 = (undefined1 (*) [32])(*pauVar11 + 4);
                              iVar7 = iVar7 + 2;
                              lVar31 = lVar31 + lVar27;
                              lVar17 = lVar17 + lVar27;
                              lVar19 = lVar19 + lVar27;
                            } while (iVar7 < (int)uVar32);
                            this = local_58;
                            iVar7 = (int)local_b0;
                          }
                          iVar10 = uVar32 - iVar7;
                          if (iVar10 != 0 && iVar7 <= (int)uVar32) {
                            puVar23 = (undefined1 *)(lVar31 + lVar37 + 1);
                            do {
                              (*pauVar11)[0] = puVar23[-1];
                              (*pauVar11)[1] = *puVar23;
                              pauVar11 = (undefined1 (*) [32])(*pauVar11 + 2);
                              puVar23 = puVar23 + lVar13;
                              iVar10 = iVar10 + -1;
                            } while (iVar10 != 0);
                          }
                          uVar15 = uVar14 + 2;
                          lVar37 = uVar14 + 3;
                          lVar22 = lVar22 + 2;
                          lVar24 = lVar24 + 2;
                          lVar21 = lVar21 + 2;
                          uVar14 = uVar15;
                        } while (lVar37 < (int)uVar9);
                      }
                      if ((int)uVar15 < (int)uVar9) {
                        lVar22 = (long)(int)uVar15;
                        do {
                          if (0 < (int)uVar32) {
                            puVar23 = (undefined1 *)
                                      ((long)(this->super_Gemm).B_data.data +
                                      lVar16 + lVar22 +
                                      (long)(this->super_Gemm).B_data.w * (long)iVar18 *
                                      (this->super_Gemm).B_data.elemsize);
                            uVar33 = uVar32;
                            do {
                              (*pauVar11)[0] = *puVar23;
                              pauVar11 = (undefined1 (*) [32])(*pauVar11 + 1);
                              puVar23 = puVar23 + lVar13;
                              uVar33 = uVar33 - 1;
                            } while (uVar33 != 0);
                          }
                          lVar22 = lVar22 + 1;
                        } while (lVar22 != (int)uVar9);
                      }
                    }
                    else {
                      transpose_pack_B_tile_int8_avxvnni
                                (local_e0,(Mat *)local_a8,iVar36,uVar9,iVar18,uVar32);
                    }
                  }
                  else {
                    transpose_pack_B_tile_int8_avxvnniint8
                              (local_e0,(Mat *)local_a8,iVar36,uVar9,iVar18,uVar32);
                  }
                }
                else {
                  transpose_pack_B_tile_int8_avx512vnni
                            (local_e0,(Mat *)local_a8,iVar36,uVar9,iVar18,uVar32);
                }
              }
              else {
                in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
                in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
                iVar10 = cpu_support_x86_avx512_vnni();
                if (iVar10 == 0) {
                  iVar10 = cpu_support_x86_avx_vnni_int8();
                  if (iVar10 == 0) {
                    iVar10 = cpu_support_x86_avx_vnni();
                    if (iVar10 == 0) {
                      uVar15 = 0;
                      lVar13 = (long)iVar18;
                      pauVar11 = (undefined1 (*) [32])local_a8._0_8_;
                      if (0xf < (int)uVar9) {
                        uVar14 = 0;
                        do {
                          lVar22 = (long)(this->super_Gemm).B_data.data +
                                   lVar13 + (lVar16 + uVar14) * (long)(this->super_Gemm).B_data.w *
                                            (this->super_Gemm).B_data.elemsize;
                          auVar42 = vpbroadcastd_avx512f();
                          vpmulld_avx512f(auVar42,_DAT_005ff0c0);
                          uVar28 = 0;
                          if (1 < (int)uVar32) {
                            iVar10 = 1;
                            do {
                              in_ZMM1 = vpgatherdd_avx512f(*(undefined4 *)(*pauVar11 + lVar22));
                              auVar41 = vpmovdw_avx512f(in_ZMM1);
                              *pauVar11 = auVar41;
                              pauVar11 = pauVar11 + 1;
                              lVar22 = lVar22 + 2;
                              iVar10 = iVar10 + 2;
                              uVar28 = uVar32 & 0xfffffffe;
                            } while (iVar10 < (int)uVar32);
                          }
                          iVar10 = uVar32 - uVar28;
                          if (iVar10 != 0 && (int)uVar28 <= (int)uVar32) {
                            do {
                              in_ZMM1 = vpgatherdd_avx512f(*(undefined4 *)(*pauVar11 + lVar22));
                              auVar40 = vpmovdb_avx512f(in_ZMM1);
                              *(undefined1 (*) [16])*pauVar11 = auVar40;
                              pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
                              lVar22 = lVar22 + 1;
                              iVar10 = iVar10 + -1;
                            } while (iVar10 != 0);
                          }
                          uVar15 = uVar14 + 0x10;
                          uVar20 = uVar14 + 0x1f;
                          uVar14 = uVar15;
                        } while (uVar20 < uVar9);
                      }
                      lVar22 = (long)(int)uVar9;
                      if ((int)((uint)uVar15 | 7) < (int)uVar9) {
                        uVar14 = uVar15 & 0xffffffff;
                        do {
                          auVar41 = vpbroadcastd_avx512vl();
                          vpmulld_avx2(auVar41,_DAT_005f2fc0);
                          uVar28 = 0;
                          if (1 < (int)uVar32) {
                            iVar10 = 1;
                            do {
                              auVar41 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
                              auVar41 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                   auVar41);
                              in_ZMM2 = ZEXT3264(auVar41);
                              in_ZMM1 = ZEXT3264((undefined1  [32])0x0);
                              auVar40 = vpmovdw_avx512vl(auVar41);
                              *(undefined1 (*) [16])*pauVar11 = auVar40;
                              pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
                              iVar10 = iVar10 + 2;
                              uVar28 = uVar32 & 0xfffffffe;
                            } while (iVar10 < (int)uVar32);
                          }
                          iVar10 = uVar32 - uVar28;
                          if (iVar10 != 0 && (int)uVar28 <= (int)uVar32) {
                            do {
                              auVar41 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
                              auVar41 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                   auVar41);
                              in_ZMM2 = ZEXT3264(auVar41);
                              in_ZMM1 = ZEXT3264((undefined1  [32])0x0);
                              auVar40 = vpmovdb_avx512vl(auVar41);
                              *(long *)*pauVar11 = auVar40._0_8_;
                              pauVar11 = (undefined1 (*) [32])(*pauVar11 + 8);
                              iVar10 = iVar10 + -1;
                            } while (iVar10 != 0);
                          }
                          uVar15 = uVar14 + 8;
                          lVar21 = uVar14 + 0xf;
                          uVar14 = uVar15;
                        } while (lVar21 < lVar22);
                      }
                      if ((int)((uint)uVar15 | 3) < (int)uVar9) {
                        uVar14 = uVar15 & 0xffffffff;
                        do {
                          auVar40 = vpbroadcastd_avx512vl();
                          vpmulld_avx(auVar40,_DAT_005f1590);
                          uVar28 = 0;
                          if (1 < (int)uVar32) {
                            iVar10 = 1;
                            do {
                              auVar40 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
                              auVar40 = vpgatherdd((undefined1  [16])0x0,auVar40);
                              in_ZMM1 = ZEXT1664(auVar40);
                              in_ZMM2 = ZEXT1664((undefined1  [16])0x0);
                              auVar40 = vpmovdw_avx512vl(auVar40);
                              *(long *)*pauVar11 = auVar40._0_8_;
                              pauVar11 = (undefined1 (*) [32])(*pauVar11 + 8);
                              iVar10 = iVar10 + 2;
                              uVar28 = uVar32 & 0xfffffffe;
                            } while (iVar10 < (int)uVar32);
                          }
                          iVar10 = uVar32 - uVar28;
                          if (iVar10 != 0 && (int)uVar28 <= (int)uVar32) {
                            do {
                              auVar40 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
                              auVar40 = vpgatherdd((undefined1  [16])0x0,auVar40);
                              in_ZMM1 = ZEXT1664(auVar40);
                              in_ZMM2 = ZEXT1664((undefined1  [16])0x0);
                              auVar40 = vpmovdb_avx512vl(auVar40);
                              *(int *)*pauVar11 = auVar40._0_4_;
                              pauVar11 = (undefined1 (*) [32])(*pauVar11 + 4);
                              iVar10 = iVar10 + -1;
                            } while (iVar10 != 0);
                          }
                          uVar15 = uVar14 + 4;
                          lVar21 = uVar14 + 7;
                          uVar14 = uVar15;
                        } while (lVar21 < lVar22);
                      }
                      if ((int)((uint)uVar15 | 1) < (int)uVar9) {
                        uVar14 = (long)(int)(uint)uVar15;
                        do {
                          lVar21 = (long)(this->super_Gemm).B_data.w *
                                   (this->super_Gemm).B_data.elemsize;
                          pvVar2 = (this->super_Gemm).B_data.data;
                          puVar23 = (undefined1 *)
                                    ((long)pvVar2 + (uVar14 + lVar16) * lVar21 + lVar13);
                          puVar25 = (undefined1 *)
                                    ((long)pvVar2 + (lVar16 + uVar14 + 1) * lVar21 + lVar13);
                          uVar28 = 0;
                          if (1 < (int)uVar32) {
                            iVar10 = 1;
                            do {
                              (*pauVar11)[0] = *puVar23;
                              (*pauVar11)[1] = puVar23[1];
                              (*pauVar11)[2] = *puVar25;
                              (*pauVar11)[3] = puVar25[1];
                              pauVar11 = (undefined1 (*) [32])(*pauVar11 + 4);
                              puVar23 = puVar23 + 2;
                              puVar25 = puVar25 + 2;
                              iVar10 = iVar10 + 2;
                              uVar28 = uVar32 & 0xfffffffe;
                            } while (iVar10 < (int)uVar32);
                          }
                          if ((int)uVar28 < (int)uVar32) {
                            lVar21 = 0;
                            do {
                              (*pauVar11)[0] = puVar23[lVar21];
                              (*pauVar11)[1] = puVar25[lVar21];
                              pauVar11 = (undefined1 (*) [32])(*pauVar11 + 2);
                              lVar21 = lVar21 + 1;
                            } while (uVar32 - uVar28 != (int)lVar21);
                          }
                          uVar15 = uVar14 + 2;
                          lVar21 = uVar14 + 3;
                          uVar14 = uVar15;
                        } while (lVar21 < lVar22);
                      }
                      if ((int)uVar15 < (int)uVar9) {
                        lVar21 = (long)(int)uVar15;
                        if (iVar7 < (int)uVar33) {
                          uVar33 = iVar7;
                        }
                        lVar24 = lVar16 + lVar21;
                        do {
                          if (0 < (int)uVar32) {
                            iVar7 = (this->super_Gemm).B_data.w;
                            pvVar2 = (this->super_Gemm).B_data.data;
                            sVar4 = (this->super_Gemm).B_data.elemsize;
                            lVar27 = 0;
                            do {
                              (*pauVar11)[lVar27] =
                                   *(undefined1 *)
                                    ((long)pvVar2 + lVar27 + sVar4 * lVar24 * (long)iVar7 + lVar13);
                              lVar27 = lVar27 + 1;
                            } while (uVar33 != (uint)lVar27);
                            pauVar11 = (undefined1 (*) [32])(*pauVar11 + lVar27);
                          }
                          lVar21 = lVar21 + 1;
                          lVar24 = lVar24 + 1;
                        } while (lVar21 != lVar22);
                      }
                    }
                    else {
                      pack_B_tile_int8_avxvnni(local_e0,(Mat *)local_a8,iVar36,uVar9,iVar18,uVar32);
                    }
                  }
                  else {
                    pack_B_tile_int8_avxvnniint8
                              (local_e0,(Mat *)local_a8,iVar36,uVar9,iVar18,uVar32);
                  }
                }
                else {
                  pack_B_tile_int8_avx512vnni(local_e0,(Mat *)local_a8,iVar36,uVar9,iVar18,uVar32);
                }
              }
              piVar12 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
              if (piVar12 != (int *)0x0) {
                LOCK();
                *piVar12 = *piVar12 + -1;
                UNLOCK();
                if (*piVar12 == 0) {
                  if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
                    if ((undefined1 (*) [32])local_a8._0_8_ != (undefined1 (*) [32])0x0) {
                      in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
                      in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
                      free((void *)local_a8._0_8_);
                    }
                  }
                  else {
                    in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
                    in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
                    (*(*(_func_int ***)local_a8._32_8_)[3])();
                  }
                }
              }
              local_68 = 0;
              local_a8._0_8_ = (void *)0x0;
              local_a8._8_4_ = 0;
              local_a8._12_4_ = 0;
              local_a8._16_8_ = 0;
              local_a8._24_4_ = 0;
              stack0xffffffffffffff80 = (undefined1  [16])0x0;
              local_70 = 0;
              iVar18 = iVar18 + TILE_K;
            } while (iVar18 < iVar35);
          }
          uVar8 = (int)local_d0 + 1;
          local_d0 = (ulong)uVar8;
        } while (uVar8 != uVar6);
      }
      opt = local_48;
      if (local_48->lightmode != false) {
        piVar12 = (this->super_Gemm).B_data.refcount;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            pvVar2 = (this->super_Gemm).B_data.data;
            pAVar3 = (this->super_Gemm).B_data.allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).B_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).B_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Gemm).B_data.data = (void *)0x0;
        (this->super_Gemm).B_data.refcount = (int *)0x0;
        (this->super_Gemm).B_data.dims = 0;
        (this->super_Gemm).B_data.w = 0;
        (this->super_Gemm).B_data.h = 0;
        (this->super_Gemm).B_data.d = 0;
        (this->super_Gemm).B_data.c = 0;
      }
      if (bVar39) {
        return -100;
      }
    }
    if (((this->super_Gemm).constantC != 0) && ((this->super_Gemm).constant_broadcast_type_C != -1))
    {
      piVar12 = (this->super_Gemm).C_data.refcount;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + 1;
        UNLOCK();
      }
      piVar12 = (this->CT_data).refcount;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          pvVar2 = (this->CT_data).data;
          pAVar3 = (this->CT_data).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (*pAVar3->_vptr_Allocator[3])();
          }
        }
      }
      (this->CT_data).cstep = 0;
      *(undefined1 (*) [16])((long)&(this->CT_data).refcount + 4) = (undefined1  [16])0x0;
      (this->CT_data).data = (void *)0x0;
      (this->CT_data).refcount = (int *)0x0;
      auVar1._0_8_ = (this->super_Gemm).C_data.data;
      auVar1._8_8_ = (this->super_Gemm).C_data.refcount;
      (this->CT_data).data = (void *)auVar1._0_8_;
      (this->CT_data).refcount = (int *)auVar1._8_8_;
      (this->CT_data).elemsize = (this->super_Gemm).C_data.elemsize;
      (this->CT_data).elempack = (this->super_Gemm).C_data.elempack;
      (this->CT_data).allocator = (this->super_Gemm).C_data.allocator;
      iVar35 = (this->super_Gemm).C_data.w;
      iVar36 = (this->super_Gemm).C_data.h;
      iVar18 = (this->super_Gemm).C_data.d;
      (this->CT_data).dims = (this->super_Gemm).C_data.dims;
      (this->CT_data).w = iVar35;
      (this->CT_data).h = iVar36;
      (this->CT_data).d = iVar18;
      (this->CT_data).c = (this->super_Gemm).C_data.c;
      (this->CT_data).cstep = (this->super_Gemm).C_data.cstep;
      if (opt->lightmode == true) {
        piVar12 = (int *)vpextrq_avx(auVar1,1);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            pvVar2 = (this->super_Gemm).C_data.data;
            pAVar3 = (this->super_Gemm).C_data.allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).C_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).C_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Gemm).C_data.data = (void *)0x0;
        (this->super_Gemm).C_data.refcount = (int *)0x0;
        (this->super_Gemm).C_data.dims = 0;
        (this->super_Gemm).C_data.w = 0;
        (this->super_Gemm).C_data.h = 0;
        (this->super_Gemm).C_data.d = 0;
        (this->super_Gemm).C_data.c = 0;
      }
    }
    if ((((this->super_Gemm).constantA != 0) || ((this->super_Gemm).constantB != 0)) ||
       (iVar35 = 0, (this->super_Gemm).constantC != 0)) {
      *(int *)&(this->super_Gemm).field_0x244 = opt->num_threads;
      iVar35 = 0;
    }
  }
  else {
    uVar8 = (this->super_Gemm).constantM;
    uVar6 = (this->super_Gemm).constantK;
    local_c8 = (ulong)uVar6;
    get_optimal_tile_mnk_int8
              (uVar8,0,uVar6,(this->super_Gemm).constant_TILE_M,(this->super_Gemm).constant_TILE_N,
               (this->super_Gemm).constant_TILE_K,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
    iVar36 = TILE_M;
    iVar35 = TILE_K;
    uVar6 = (int)(uVar8 + TILE_M + -1) / TILE_M;
    iVar18 = iVar35;
    local_40 = (ulong)uVar8;
    if (3 < TILE_K) {
      iVar7 = cpu_support_x86_avx512_vnni();
      bVar39 = true;
      if (iVar7 == 0) {
        iVar7 = cpu_support_x86_avx_vnni();
        bVar39 = iVar7 != 0;
      }
      iVar7 = cpu_support_x86_avx_vnni_int8();
      if (!(bool)(bVar39 ^ 1U | iVar7 != 0)) {
        iVar18 = 0x40;
        if (((iVar36 < 0x10) && (iVar18 = 0x20, iVar36 < 8)) && (iVar18 = 0x10, iVar36 < 4)) {
          iVar18 = (uint)(1 < iVar36) * 4 + 4;
        }
        iVar18 = iVar18 + iVar35;
      }
    }
    uVar15 = local_c8;
    Mat::create(&this->AT_data,iVar18 * iVar36,((int)local_c8 + iVar35 + -1) / iVar35,uVar6,1,
                (Allocator *)0x0);
    if ((this->AT_data).data == (void *)0x0) {
      bVar39 = true;
    }
    else {
      bVar39 = (long)(this->AT_data).c * (this->AT_data).cstep == 0;
    }
    if (!bVar39) {
      local_48 = opt;
      if (0 < (int)uVar6) {
        A = &(this->super_Gemm).A_data;
        local_d0 = 0;
        do {
          if (0 < (int)uVar15) {
            iVar36 = TILE_M * (int)local_d0;
            uVar8 = (int)local_40 - iVar36;
            lVar16 = (long)iVar36;
            iVar35 = 0;
            do {
              uVar9 = uVar8;
              if (TILE_M < (int)uVar8) {
                uVar9 = TILE_M;
              }
              uVar32 = (int)uVar15 - iVar35;
              if (TILE_K < (int)uVar32) {
                uVar32 = TILE_K;
              }
              local_a8._16_8_ = (this->AT_data).elemsize;
              iStack_7c = (this->AT_data).w;
              local_68 = (size_t)iStack_7c;
              local_a8._24_4_ = (this->AT_data).elempack;
              local_a8._32_8_ = (this->AT_data).allocator;
              local_a8._0_8_ =
                   (long)(this->AT_data).data +
                   local_a8._16_8_ * local_68 * (long)(iVar35 / TILE_K) +
                   (long)(iVar36 / TILE_M) * (this->AT_data).cstep * local_a8._16_8_;
              local_a8._8_4_ = 0;
              local_a8._12_4_ = 0;
              local_a8._40_4_ = 2;
              uStack_78 = 0x100000001;
              local_70 = 1;
              if ((this->super_Gemm).transA == 0) {
                pack_A_tile_int8(A,(Mat *)local_a8,iVar36,uVar9,iVar35,uVar32);
              }
              else {
                iVar18 = cpu_support_x86_avx512_vnni();
                if (iVar18 == 0) {
                  iVar18 = cpu_support_x86_avx_vnni_int8();
                  if (iVar18 == 0) {
                    iVar18 = cpu_support_x86_avx_vnni();
                    if (iVar18 == 0) {
                      iVar18 = (this->super_Gemm).A_data.w;
                      lVar13 = (long)iVar18;
                      uVar14 = 0;
                      pauVar30 = (undefined1 (*) [16])local_a8._0_8_;
                      if (0xf < (int)uVar9) {
                        uVar20 = 0;
                        do {
                          pvVar2 = (this->super_Gemm).A_data.data;
                          lVar22 = (long)(this->super_Gemm).A_data.w * (long)iVar35 *
                                   (this->super_Gemm).A_data.elemsize;
                          if ((int)uVar32 < 2) {
                            pauVar29 = (undefined1 (*) [16])
                                       ((long)pvVar2 + lVar22 + lVar16 + uVar20);
                            uVar33 = 0;
                          }
                          else {
                            lVar22 = (long)pvVar2 + lVar22 + uVar20;
                            iVar7 = 1;
                            do {
                              auVar40 = *(undefined1 (*) [16])(lVar22 + lVar13 + lVar16);
                              in_ZMM1 = ZEXT1664(auVar40);
                              auVar44 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar22 + lVar16),
                                                       auVar40);
                              in_ZMM2 = ZEXT1664(auVar44);
                              auVar40 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar22 + lVar16),
                                                       auVar40);
                              *pauVar30 = auVar44;
                              pauVar30[1] = auVar40;
                              pauVar30 = pauVar30 + 2;
                              lVar22 = lVar22 + iVar18 * 2;
                              iVar7 = iVar7 + 2;
                            } while (iVar7 < (int)uVar32);
                            pauVar29 = (undefined1 (*) [16])(lVar22 + lVar16);
                            uVar33 = uVar32 & 0xfffffffe;
                          }
                          iVar7 = uVar32 - uVar33;
                          if (iVar7 != 0 && (int)uVar33 <= (int)uVar32) {
                            do {
                              *pauVar30 = *pauVar29;
                              pauVar30 = pauVar30 + 1;
                              pauVar29 = (undefined1 (*) [16])(*pauVar29 + lVar13);
                              iVar7 = iVar7 + -1;
                            } while (iVar7 != 0);
                          }
                          uVar14 = uVar20 + 0x10;
                          uVar26 = uVar20 + 0x1f;
                          uVar15 = local_c8;
                          uVar20 = uVar14;
                        } while (uVar26 < uVar9);
                      }
                      if ((int)((uint)uVar14 | 7) < (int)uVar9) {
                        lVar22 = (uVar14 & 0xffffffff) + lVar16;
                        lVar21 = lVar22 + lVar13;
                        uVar20 = uVar14 & 0xffffffff;
                        do {
                          pvVar2 = (this->super_Gemm).A_data.data;
                          lVar24 = (long)(this->super_Gemm).A_data.w * (long)iVar35 *
                                   (this->super_Gemm).A_data.elemsize;
                          if ((int)uVar32 < 2) {
                            lVar27 = (long)pvVar2 + lVar16 + uVar20;
                            uVar33 = 0;
                          }
                          else {
                            lVar27 = (long)pvVar2 + lVar22;
                            lVar37 = (long)pvVar2 + lVar21;
                            iVar7 = 1;
                            do {
                              in_ZMM1 = ZEXT864(*(ulong *)(lVar37 + lVar24));
                              auVar40._8_8_ = 0;
                              auVar40._0_8_ = *(ulong *)(lVar27 + lVar24);
                              auVar44._8_8_ = 0;
                              auVar44._0_8_ = *(ulong *)(lVar37 + lVar24);
                              auVar40 = vpunpcklbw_avx(auVar40,auVar44);
                              *pauVar30 = auVar40;
                              pauVar30 = pauVar30 + 1;
                              iVar7 = iVar7 + 2;
                              lVar27 = lVar27 + iVar18 * 2;
                              lVar37 = lVar37 + iVar18 * 2;
                              uVar33 = uVar32 & 0xfffffffe;
                            } while (iVar7 < (int)uVar32);
                          }
                          puVar38 = (undefined8 *)(lVar27 + lVar24);
                          iVar7 = uVar32 - uVar33;
                          if (iVar7 != 0 && (int)uVar33 <= (int)uVar32) {
                            do {
                              *(undefined8 *)*pauVar30 = *puVar38;
                              pauVar30 = (undefined1 (*) [16])(*pauVar30 + 8);
                              puVar38 = (undefined8 *)((long)puVar38 + lVar13);
                              iVar7 = iVar7 + -1;
                            } while (iVar7 != 0);
                          }
                          uVar14 = uVar20 + 8;
                          lVar24 = uVar20 + 0xf;
                          lVar22 = lVar22 + 8;
                          lVar21 = lVar21 + 8;
                          uVar15 = local_c8;
                          uVar20 = uVar14;
                        } while (lVar24 < (int)uVar9);
                      }
                      if ((int)((uint)uVar14 | 3) < (int)uVar9) {
                        local_38 = (long)iVar35;
                        lVar24 = (long)(iVar18 * 2);
                        local_bc = uVar32 & 0xfffffffe;
                        local_50 = (long)(int)uVar9;
                        lVar22 = (uVar14 & 0xffffffff) + lVar16;
                        local_b0 = (iVar18 + 3) + lVar22;
                        local_d8 = (iVar18 + 2) + lVar22;
                        lVar21 = lVar22 + lVar13;
                        pMVar5 = (Mat *)((iVar18 + 1) + lVar22);
                        uVar20 = uVar14 & 0xffffffff;
                        do {
                          local_e0 = pMVar5;
                          pvVar2 = (this->super_Gemm).A_data.data;
                          lVar27 = (this->super_Gemm).A_data.w * local_38 *
                                   (this->super_Gemm).A_data.elemsize;
                          if ((int)uVar32 < 2) {
                            lVar37 = (long)pvVar2 + lVar16 + uVar20;
                            uVar33 = 0;
                          }
                          else {
                            lVar37 = (long)pvVar2 + lVar22;
                            lVar31 = (long)pvVar2 + local_b0;
                            lVar17 = (long)pvVar2 + local_d8;
                            lVar19 = (long)&local_e0->data + (long)pvVar2;
                            lVar34 = (long)pvVar2 + lVar21;
                            iVar7 = 1;
                            do {
                              (*pauVar30)[0] = *(undefined1 *)(lVar37 + lVar27);
                              (*pauVar30)[1] = *(undefined1 *)(lVar34 + lVar27);
                              (*pauVar30)[2] = *(undefined1 *)(lVar37 + 1 + lVar27);
                              (*pauVar30)[3] = *(undefined1 *)(lVar19 + lVar27);
                              (*pauVar30)[4] = *(undefined1 *)(lVar37 + 2 + lVar27);
                              (*pauVar30)[5] = *(undefined1 *)(lVar17 + lVar27);
                              (*pauVar30)[6] = *(undefined1 *)(lVar37 + 3 + lVar27);
                              (*pauVar30)[7] = *(undefined1 *)(lVar31 + lVar27);
                              pauVar30 = (undefined1 (*) [16])(*pauVar30 + 8);
                              iVar7 = iVar7 + 2;
                              lVar37 = lVar37 + lVar24;
                              lVar31 = lVar31 + lVar24;
                              lVar17 = lVar17 + lVar24;
                              lVar19 = lVar19 + lVar24;
                              lVar34 = lVar34 + lVar24;
                              uVar15 = local_c8;
                              uVar33 = local_bc;
                            } while (iVar7 < (int)uVar32);
                          }
                          iVar7 = uVar32 - uVar33;
                          if (iVar7 != 0 && (int)uVar33 <= (int)uVar32) {
                            puVar23 = (undefined1 *)(lVar37 + lVar27 + 3);
                            do {
                              (*pauVar30)[0] = puVar23[-3];
                              (*pauVar30)[1] = puVar23[-2];
                              (*pauVar30)[2] = puVar23[-1];
                              (*pauVar30)[3] = *puVar23;
                              pauVar30 = (undefined1 (*) [16])(*pauVar30 + 4);
                              puVar23 = puVar23 + lVar13;
                              iVar7 = iVar7 + -1;
                            } while (iVar7 != 0);
                          }
                          uVar14 = uVar20 + 4;
                          lVar27 = uVar20 + 7;
                          lVar22 = lVar22 + 4;
                          local_b0 = local_b0 + 4;
                          local_d8 = local_d8 + 4;
                          lVar21 = lVar21 + 4;
                          pMVar5 = (Mat *)((long)&local_e0->data + 4);
                          uVar20 = uVar14;
                          this = local_58;
                        } while (lVar27 < local_50);
                      }
                      uVar33 = (uint)uVar14;
                      if ((int)(uVar33 | 1) < (int)uVar9) {
                        local_e0 = (Mat *)(long)iVar35;
                        lVar27 = (long)(iVar18 * 2);
                        local_d8 = CONCAT44(local_d8._4_4_,uVar32) & 0xfffffffffffffffe;
                        lVar22 = (int)uVar33 + lVar16;
                        lVar24 = (iVar18 + 1) + lVar22;
                        lVar21 = lVar22 + lVar13;
                        uVar20 = (long)(int)uVar33;
                        do {
                          pvVar2 = (this->super_Gemm).A_data.data;
                          lVar37 = (long)(this->super_Gemm).A_data.w * (long)local_e0 *
                                   (this->super_Gemm).A_data.elemsize;
                          if ((int)uVar32 < 2) {
                            lVar31 = (long)pvVar2 + lVar16 + uVar20;
                            iVar18 = 0;
                          }
                          else {
                            lVar31 = (long)pvVar2 + lVar22;
                            lVar17 = (long)pvVar2 + lVar24;
                            lVar19 = (long)pvVar2 + lVar21;
                            iVar18 = 1;
                            do {
                              (*pauVar30)[0] = *(undefined1 *)(lVar31 + lVar37);
                              (*pauVar30)[1] = *(undefined1 *)(lVar19 + lVar37);
                              (*pauVar30)[2] = *(undefined1 *)(lVar31 + 1 + lVar37);
                              (*pauVar30)[3] = *(undefined1 *)(lVar17 + lVar37);
                              pauVar30 = (undefined1 (*) [16])(*pauVar30 + 4);
                              iVar18 = iVar18 + 2;
                              lVar31 = lVar31 + lVar27;
                              lVar17 = lVar17 + lVar27;
                              lVar19 = lVar19 + lVar27;
                            } while (iVar18 < (int)uVar32);
                            this = local_58;
                            iVar18 = (int)local_d8;
                          }
                          iVar7 = uVar32 - iVar18;
                          if (iVar7 != 0 && iVar18 <= (int)uVar32) {
                            puVar23 = (undefined1 *)(lVar31 + lVar37 + 1);
                            do {
                              (*pauVar30)[0] = puVar23[-1];
                              (*pauVar30)[1] = *puVar23;
                              pauVar30 = (undefined1 (*) [16])(*pauVar30 + 2);
                              puVar23 = puVar23 + lVar13;
                              iVar7 = iVar7 + -1;
                            } while (iVar7 != 0);
                          }
                          uVar14 = uVar20 + 2;
                          lVar37 = uVar20 + 3;
                          lVar22 = lVar22 + 2;
                          lVar24 = lVar24 + 2;
                          lVar21 = lVar21 + 2;
                          uVar15 = local_c8;
                          uVar20 = uVar14;
                        } while (lVar37 < (int)uVar9);
                      }
                      if ((int)uVar14 < (int)uVar9) {
                        lVar22 = (long)(int)uVar14;
                        do {
                          if (0 < (int)uVar32) {
                            puVar23 = (undefined1 *)
                                      ((long)(this->super_Gemm).A_data.data +
                                      lVar16 + lVar22 + (long)(this->super_Gemm).A_data.w *
                                                        (long)iVar35 *
                                                        (this->super_Gemm).A_data.elemsize);
                            uVar33 = uVar32;
                            do {
                              (*pauVar30)[0] = *puVar23;
                              pauVar30 = (undefined1 (*) [16])(*pauVar30 + 1);
                              puVar23 = puVar23 + lVar13;
                              uVar33 = uVar33 - 1;
                            } while (uVar33 != 0);
                          }
                          lVar22 = lVar22 + 1;
                        } while (lVar22 != (int)uVar9);
                      }
                    }
                    else {
                      transpose_pack_A_tile_int8_avxvnni
                                (A,(Mat *)local_a8,iVar36,uVar9,iVar35,uVar32);
                    }
                  }
                  else {
                    transpose_pack_A_tile_int8_avxvnniint8
                              (A,(Mat *)local_a8,iVar36,uVar9,iVar35,uVar32);
                  }
                }
                else {
                  transpose_pack_A_tile_int8_avx512vnni
                            (A,(Mat *)local_a8,iVar36,uVar9,iVar35,uVar32);
                }
              }
              piVar12 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
              if (piVar12 != (int *)0x0) {
                LOCK();
                *piVar12 = *piVar12 + -1;
                UNLOCK();
                if (*piVar12 == 0) {
                  if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
                    if ((undefined1 (*) [16])local_a8._0_8_ != (undefined1 (*) [16])0x0) {
                      free((void *)local_a8._0_8_);
                    }
                  }
                  else {
                    (*(*(_func_int ***)local_a8._32_8_)[3])();
                  }
                }
              }
              local_68 = 0;
              local_a8._0_8_ = (void *)0x0;
              local_a8._8_4_ = 0;
              local_a8._12_4_ = 0;
              local_a8._16_8_ = 0;
              local_a8._24_4_ = 0;
              stack0xffffffffffffff80 = (undefined1  [16])0x0;
              local_70 = 0;
              iVar35 = iVar35 + TILE_K;
            } while (iVar35 < (int)uVar15);
          }
          uVar8 = (int)local_d0 + 1;
          local_d0 = (ulong)uVar8;
        } while (uVar8 != uVar6);
      }
      opt = local_48;
      if (local_48->lightmode != false) {
        piVar12 = (this->super_Gemm).A_data.refcount;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            pvVar2 = (this->super_Gemm).A_data.data;
            pAVar3 = (this->super_Gemm).A_data.allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).A_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).A_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Gemm).A_data.data = (void *)0x0;
        (this->super_Gemm).A_data.refcount = (int *)0x0;
        (this->super_Gemm).A_data.dims = 0;
        (this->super_Gemm).A_data.w = 0;
        (this->super_Gemm).A_data.h = 0;
        (this->super_Gemm).A_data.d = 0;
        (this->super_Gemm).A_data.c = 0;
      }
      if (bVar39) {
        return -100;
      }
      goto LAB_004c98d7;
    }
LAB_004c99a5:
    iVar35 = -100;
  }
  return iVar35;
}

Assistant:

int Gemm_x86_avx512::create_pipeline_int8(const Option& opt)
{
    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

#if NCNN_AVX512VNNI || NCNN_AVXVNNI
        bool has_w_shift = false;
        if (TILE_K >= 4)
        {
            has_w_shift = ncnn::cpu_support_x86_avx512_vnni() || ncnn::cpu_support_x86_avx_vnni();
#if NCNN_AVXVNNIINT8
            if (ncnn::cpu_support_x86_avx_vnni_int8())
                has_w_shift = false;
#endif // NCNN_AVXVNNIINT8
        }
        if (has_w_shift)
        {
            int w_shift_count = TILE_M >= 16 ? 16 : TILE_M >= 8 ? 8 : TILE_M >= 4 ? 4 : TILE_M >= 2 ? 2 : 1;
            AT_data.create((TILE_K + w_shift_count * 4) * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        else
#endif // NCNN_AVX512VNNI || NCNN_AVXVNNI
        {
            AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            A_data.release();
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 1u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_N; ppj++)
        {
            const int j = ppj * TILE_N;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_jj = std::min((N - j), TILE_N);
                const int max_kk = std::min((K - k), TILE_K);

                Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (transB)
                {
                    pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
                else
                {
                    transpose_pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            B_data.release();
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

        if (opt.lightmode)
            C_data.release();
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}